

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::LineSegmentsRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ImVec2 IVar6;
  int iVar7;
  ImU32 IVar8;
  GetterYs<float> *pGVar9;
  TransformerLogLog *pTVar10;
  ImPlotPlot *pIVar11;
  GetterYRef *pGVar12;
  ImDrawVert *pIVar13;
  uint *puVar14;
  ImPlotContext *pIVar15;
  ImPlotContext *pIVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  double dVar21;
  double dVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  
  pIVar15 = GImPlot;
  pGVar9 = this->Getter1;
  pTVar10 = this->Transformer;
  iVar7 = pGVar9->Count;
  fVar19 = *(float *)((long)pGVar9->Ys +
                     (long)(((prim + pGVar9->Offset) % iVar7 + iVar7) % iVar7) *
                     (long)pGVar9->Stride);
  dVar21 = log10((pGVar9->XScale * (double)prim + pGVar9->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar2 = pIVar15->LogDenX;
  pIVar11 = pIVar15->CurrentPlot;
  dVar3 = (pIVar11->XAxis).Range.Min;
  dVar4 = (pIVar11->XAxis).Range.Max;
  dVar22 = log10((double)fVar19 / pIVar11->YAxis[pTVar10->YAxis].Range.Min);
  pIVar16 = GImPlot;
  iVar7 = pTVar10->YAxis;
  pIVar11 = pIVar15->CurrentPlot;
  dVar5 = pIVar11->YAxis[iVar7].Range.Min;
  fVar23 = (float)((((double)(float)(dVar21 / dVar2) * (dVar4 - dVar3) + dVar3) -
                   (pIVar11->XAxis).Range.Min) * pIVar15->Mx +
                  (double)pIVar15->PixelRange[iVar7].Min.x);
  fVar18 = (float)((((double)(float)(dVar22 / pIVar15->LogDenY[iVar7]) *
                     (pIVar11->YAxis[iVar7].Range.Max - dVar5) + dVar5) - dVar5) *
                   pIVar15->My[iVar7] + (double)pIVar15->PixelRange[iVar7].Min.y);
  pGVar12 = this->Getter2;
  pTVar10 = this->Transformer;
  dVar2 = pGVar12->YRef;
  dVar21 = log10(((double)prim * pGVar12->XScale + pGVar12->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar3 = pIVar16->LogDenX;
  pIVar11 = pIVar16->CurrentPlot;
  dVar4 = (pIVar11->XAxis).Range.Min;
  dVar5 = (pIVar11->XAxis).Range.Max;
  dVar22 = log10(dVar2 / pIVar11->YAxis[pTVar10->YAxis].Range.Min);
  iVar7 = pTVar10->YAxis;
  pIVar11 = pIVar16->CurrentPlot;
  dVar2 = pIVar11->YAxis[iVar7].Range.Min;
  fVar24 = (float)((((double)(float)(dVar21 / dVar3) * (dVar5 - dVar4) + dVar4) -
                   (pIVar11->XAxis).Range.Min) * pIVar16->Mx +
                  (double)pIVar16->PixelRange[iVar7].Min.x);
  fVar25 = (float)((((double)(float)(dVar22 / pIVar16->LogDenY[iVar7]) *
                     (pIVar11->YAxis[iVar7].Range.Max - dVar2) + dVar2) - dVar2) *
                   pIVar16->My[iVar7] + (double)pIVar16->PixelRange[iVar7].Min.y);
  fVar19 = fVar18;
  if (fVar25 <= fVar18) {
    fVar19 = fVar25;
  }
  bVar17 = false;
  if ((fVar19 < (cull_rect->Max).y) &&
     (fVar19 = (float)(~-(uint)(fVar25 <= fVar18) & (uint)fVar25 |
                      -(uint)(fVar25 <= fVar18) & (uint)fVar18), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar19 && fVar19 != *pfVar1)) {
    fVar19 = fVar23;
    if (fVar24 <= fVar23) {
      fVar19 = fVar24;
    }
    bVar17 = false;
    if (fVar19 < (cull_rect->Max).x) {
      fVar19 = (float)(~-(uint)(fVar24 <= fVar23) & (uint)fVar24 |
                      -(uint)(fVar24 <= fVar23) & (uint)fVar23);
      bVar17 = (cull_rect->Min).x <= fVar19 && fVar19 != (cull_rect->Min).x;
    }
  }
  if (bVar17 != false) {
    fVar19 = this->Weight;
    IVar8 = this->Col;
    IVar6 = *uv;
    fVar26 = fVar24 - fVar23;
    fVar27 = fVar25 - fVar18;
    fVar20 = fVar26 * fVar26 + fVar27 * fVar27;
    if (0.0 < fVar20) {
      if (fVar20 < 0.0) {
        fVar20 = sqrtf(fVar20);
      }
      else {
        fVar20 = SQRT(fVar20);
      }
      fVar26 = fVar26 * (1.0 / fVar20);
      fVar27 = fVar27 * (1.0 / fVar20);
    }
    fVar19 = fVar19 * 0.5;
    fVar26 = fVar26 * fVar19;
    fVar19 = fVar19 * fVar27;
    pIVar13 = DrawList->_VtxWritePtr;
    (pIVar13->pos).x = fVar19 + fVar23;
    (pIVar13->pos).y = fVar18 - fVar26;
    pIVar13->uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13->col = IVar8;
    pIVar13[1].pos.x = fVar19 + fVar24;
    pIVar13[1].pos.y = fVar25 - fVar26;
    pIVar13[1].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[1].col = IVar8;
    pIVar13[2].pos.x = fVar24 - fVar19;
    pIVar13[2].pos.y = fVar26 + fVar25;
    pIVar13[2].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[2].col = IVar8;
    pIVar13[3].pos.x = fVar23 - fVar19;
    pIVar13[3].pos.y = fVar26 + fVar18;
    pIVar13[3].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[3].col = IVar8;
    DrawList->_VtxWritePtr = pIVar13 + 4;
    puVar14 = DrawList->_IdxWritePtr;
    *puVar14 = DrawList->_VtxCurrentIdx;
    puVar14[1] = DrawList->_VtxCurrentIdx + 1;
    puVar14[2] = DrawList->_VtxCurrentIdx + 2;
    puVar14[3] = DrawList->_VtxCurrentIdx;
    puVar14[4] = DrawList->_VtxCurrentIdx + 2;
    puVar14[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar14 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  return bVar17;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }